

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O0

void __thiscall jbcoin::csprng_engine::operator()(csprng_engine *this,void *ptr,size_t count)

{
  int iVar1;
  int result;
  lock_guard<std::mutex> lock;
  size_t count_local;
  void *ptr_local;
  csprng_engine *this_local;
  
  lock._M_device = (mutex_type *)count;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->mutex_);
  iVar1 = RAND_bytes((uchar *)ptr,(int)lock._M_device);
  if (iVar1 != 1) {
    Throw<std::runtime_error,char_const(&)[21]>((char (*) [21])"Insufficient entropy");
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
csprng_engine::operator()(void *ptr, std::size_t count)
{
    std::lock_guard<std::mutex> lock (mutex_);

    auto const result = RAND_bytes (
        reinterpret_cast<unsigned char*>(ptr),
        count);

    if (result != 1)
        Throw<std::runtime_error> ("Insufficient entropy");
}